

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  cartesian_cubic<float> *lattice;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar1;
  allocator local_4471;
  string local_4470 [32];
  Matrix<double,__1,_1,_0,__1,_1> local_4450;
  Matrix<double,__1,_1,_0,__1,_1> local_4440;
  double local_4430;
  double local_4428;
  Scalar local_4420;
  Scalar local_4418;
  Scalar local_4410;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_4408;
  Scalar local_43e8;
  Scalar local_43e0;
  Scalar local_43d8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_43d0;
  int local_43ac;
  undefined1 local_43a8 [8];
  vector extent;
  undefined1 local_4390 [8];
  vector origin;
  Scalar local_4378;
  Scalar local_4370;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_4368;
  int local_4344;
  undefined1 local_4340 [8];
  vector scale;
  si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> bucky;
  e_datatype local_42c8 [5];
  allocator local_42b1;
  string local_42b0 [36];
  int local_428c [3];
  cartesian_cubic<float> *local_4280;
  cartesian_cubic<float> *cc;
  isosurface mc;
  char **argv_local;
  int argc_local;
  
  mc.triangles[0xff]._56_8_ = argv;
  sisl::utility::isosurface::isosurface((isosurface *)&cc);
  local_428c[2] = 0x20;
  local_428c[1] = 0x20;
  local_428c[0] = 0x20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_42b0,"data/Bucky.raw",&local_42b1);
  local_42c8[0] = SDT_UINT8;
  bucky.m_vUserScale.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ._7_1_ = 0;
  lattice = sisl::io::read_raw_file<float>
                      (local_428c + 2,local_428c + 1,local_428c,(string *)local_42b0,local_42c8,
                       (bool *)((long)&bucky.m_vUserScale.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_rows + 7));
  std::__cxx11::string::~string(local_42b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_42b1);
  local_4280 = lattice;
  sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::si_function
            ((si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *)
             &scale.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             lattice);
  local_4344 = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_4340,&local_4344);
  local_4370 = 31.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_4368,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_4340,
             &local_4370);
  local_4378 = 31.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_4368,&local_4378);
  origin.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0x403f000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar1,(Scalar *)
                    &origin.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_4368);
  sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::set_scale
            ((si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *)
             &scale.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (vector *)local_4340);
  extent.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_4390,
             (int *)((long)&extent.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4));
  local_43ac = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_43a8,&local_43ac);
  local_43d8 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_43d0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_4390,
             &local_43d8);
  local_43e0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_43d0,&local_43e0);
  local_43e8 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar1,&local_43e8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_43d0);
  local_4410 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_4408,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_43a8,
             &local_4410);
  local_4418 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_4408,&local_4418);
  local_4420 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar1,&local_4420);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_4408);
  local_4428 = 127.0;
  local_4430 = 0.05;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            (&local_4440,(Matrix<double,__1,_1,_0,__1,_1> *)local_4390);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            (&local_4450,(Matrix<double,__1,_1,_0,__1,_1> *)local_43a8);
  sisl::utility::isosurface::march_function
            ((isosurface *)&cc,
             (function *)
             &scale.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             &local_4428,&local_4430,&local_4440,&local_4450,true,(function *)0x0,(function *)0x0,
             (function *)0x0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_4450);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_4440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4470,"bucky.ply",&local_4471);
  sisl::utility::isosurface::write_surface((isosurface *)&cc,(string *)local_4470);
  std::__cxx11::string::~string(local_4470);
  std::allocator<char>::~allocator((allocator<char> *)&local_4471);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_43a8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_4390);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_4340);
  sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::~si_function
            ((si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *)
             &scale.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  sisl::utility::isosurface::~isosurface((isosurface *)&cc);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{

	sisl::utility::isosurface mc;

    // This reads the data into memory, we specify float here,
    // which means that the lattice will hold floating values
    // but we could choose other, more compact data types
    cartesian_cubic<float> *cc = sisl::io::read_raw_file<float>(
                32, 32, 32, "data/Bucky.raw", SDT_UINT8);

    
    // Next, combine this data with a basis function in a si_function
    si_function<
        cartesian_cubic<float>, // specify the lattice (and its data type)
        tp_linear,              // specify the basis function
        3> bucky(cc);           // specify the dimension, and call this si_function bucky (fed with the cc lattice)
   
    // by default, an si_fuction has no scaling set, it'll exend to the maximum 
    // boundary of the lattice, 32 x 32 x 32 in this case
    vector scale(3);
    // Scaling is in the form f(s*x, s*y, s*z), so we specify 32-1,32-1,32-1 as scale
    scale << 31.,31.,31.;
    bucky.set_scale(scale);


    // Now we can just use the marching cubes algorithm to march over the data
    vector origin(3), extent(3);

    // Setup the volume over which MC will run
    origin << 0,0,0;
    extent << 1,1,1;

    mc.march_function(
            &bucky,
            127.0,
            0.05,
            origin,
            extent,
            true
    );

    // Write the output as a ply file
    mc.write_surface("bucky.ply");
}